

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.h
# Opt level: O1

void __thiscall CVmObjFrameRef::get_defobj(CVmObjFrameRef *this,vm_val_t *result)

{
  long *plVar1;
  long lVar2;
  vm_obj_id_t *pvVar3;
  vm_obj_id_t vVar4;
  
  plVar1 = (long *)(this->super_CVmObject).ext_;
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    pvVar3 = (vm_obj_id_t *)(plVar1 + 7);
  }
  else {
    vVar4 = 0;
    if (*(int *)(lVar2 + -0x90) != 5) goto LAB_002623d0;
    pvVar3 = (vm_obj_id_t *)(lVar2 + -0x88);
  }
  vVar4 = *pvVar3;
LAB_002623d0:
  result->typ = VM_OBJ;
  (result->val).obj = vVar4;
  if (vVar4 != 0) {
    return;
  }
  result->typ = VM_NIL;
  return;
}

Assistant:

vm_frameref_ext *get_ext() const { return (vm_frameref_ext *)ext_; }